

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

void free_docio_object(docio_object *doc,uint8_t key_alloc,uint8_t meta_alloc,uint8_t body_alloc)

{
  char in_CL;
  char in_DL;
  char in_SIL;
  long in_RDI;
  
  if (in_RDI != 0) {
    if (in_SIL != '\0') {
      free(*(void **)(in_RDI + 0x18));
      *(undefined8 *)(in_RDI + 0x18) = 0;
    }
    if (in_DL != '\0') {
      free(*(void **)(in_RDI + 0x28));
      *(undefined8 *)(in_RDI + 0x28) = 0;
    }
    if (in_CL != '\0') {
      free(*(void **)(in_RDI + 0x30));
      *(undefined8 *)(in_RDI + 0x30) = 0;
    }
  }
  return;
}

Assistant:

void free_docio_object(struct docio_object *doc, uint8_t key_alloc,
                       uint8_t meta_alloc, uint8_t body_alloc) {
    if (!doc) {
        return;
    }

    if (key_alloc) {
        free(doc->key);
        doc->key = NULL;
    }
    if (meta_alloc) {
        free(doc->meta);
        doc->meta = NULL;
    }
    if (body_alloc) {
        free(doc->body);
        doc->body = NULL;
    }
}